

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O2

size_t compressAuto(Encoder *e,size_t nlines,size_t *lenIn,u8 **strIn,size_t size,u8 *output,
                   size_t *lenOut,u8 **strOut,int simd)

{
  element_type *peVar1;
  ushort uVar2;
  size_t sVar3;
  bool avoidBranch;
  bool noSuffixOpt;
  
  peVar1 = (e->symbolTable).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((uint)peVar1->nSymbols * 0x41 < (uint)peVar1->lenHisto[1] * 100) &&
     ((uint)peVar1->lenHisto[1] * 0x5f < (uint)peVar1->suffixLim * 100)) {
    noSuffixOpt = true;
    avoidBranch = false;
  }
  else {
    uVar2 = (ushort)*(undefined4 *)peVar1->lenHisto;
    if (((ushort)(uVar2 - 0x19) < 0x43) &&
       ((uVar2 < 0x2b ||
        (((uint)peVar1->lenHisto[7] + (uint)peVar1->lenHisto[6] < 0x1d &&
         ((uVar2 < 0x48 || (peVar1->lenHisto[2] < 0x48)))))))) {
      avoidBranch = true;
    }
    else {
      avoidBranch = false;
    }
    noSuffixOpt = false;
  }
  sVar3 = _compressImpl(e,nlines,lenIn,strIn,size,output,lenOut,strOut,noSuffixOpt,avoidBranch,simd)
  ;
  return sVar3;
}

Assistant:

inline size_t _compressAuto(Encoder *e, size_t nlines, size_t lenIn[], u8 *strIn[], size_t size, u8 *output, size_t *lenOut, u8 *strOut[], int simd) {
	bool avoidBranch = false, noSuffixOpt = false;
	if (100*e->symbolTable->lenHisto[1] > 65*e->symbolTable->nSymbols && 100*e->symbolTable->suffixLim > 95*e->symbolTable->lenHisto[1]) {
		noSuffixOpt = true;
	} else if ((e->symbolTable->lenHisto[0] > 24 && e->symbolTable->lenHisto[0] < 92) &&
	           (e->symbolTable->lenHisto[0] < 43 || e->symbolTable->lenHisto[6] + e->symbolTable->lenHisto[7] < 29) &&
	           (e->symbolTable->lenHisto[0] < 72 || e->symbolTable->lenHisto[2] < 72)) {
		avoidBranch = true;
	}
	return _compressImpl(e, nlines, lenIn, strIn, size, output, lenOut, strOut, noSuffixOpt, avoidBranch, simd);
}